

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O0

int coda_mem_array_add_element(coda_mem_array *type,coda_dynamic_type *element)

{
  coda_dynamic_type **ppcVar1;
  bool bVar2;
  coda_dynamic_type **new_element;
  long index;
  coda_dynamic_type *element_local;
  coda_mem_array *type_local;
  
  if (type == (coda_mem_array *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x2a2);
    type_local._4_4_ = -1;
  }
  else if (element == (coda_dynamic_type *)0x0) {
    coda_set_error(-100,"element argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x2a7);
    type_local._4_4_ = -1;
  }
  else if (type->definition->base_type == element->definition) {
    if (type->definition->num_elements < 1) {
      if (type->num_elements % 0x10 == 0) {
        ppcVar1 = (coda_dynamic_type **)realloc(type->element,(type->num_elements + 0x10) * 8);
        if (ppcVar1 == (coda_dynamic_type **)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                         (type->num_elements + 0x10) * 8,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                         ,0x2cb);
          return -1;
        }
        type->element = ppcVar1;
      }
      type->num_elements = type->num_elements + 1;
      type->element[type->num_elements + -1] = element;
    }
    else {
      new_element = (coda_dynamic_type **)0x0;
      while( true ) {
        bVar2 = false;
        if ((long)new_element < type->num_elements) {
          bVar2 = type->element[(long)new_element] != (coda_dynamic_type *)0x0;
        }
        if (!bVar2) break;
        new_element = (coda_dynamic_type **)((long)new_element + 1);
      }
      if (type->num_elements <= (long)new_element) {
        coda_set_error(-0x65,"array index (%ld) is not in the range [0,%ld) (%s:%u)",new_element,
                       type->num_elements,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                       ,700);
        return -1;
      }
      type->element[(long)new_element] = element;
    }
    type_local._4_4_ = 0;
  }
  else {
    coda_set_error(-400,"trying to add array element \'%ld\' of incompatible type (%s:%u)",
                   type->num_elements,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x2ad);
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_mem_array_add_element(coda_mem_array *type, coda_dynamic_type *element)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (element == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "element argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->definition->base_type != element->definition)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "trying to add array element '%ld' of incompatible type (%s:%u)",
                       type->num_elements, __FILE__, __LINE__);
        return -1;
    }
    if (type->definition->num_elements > 0)
    {
        long index = 0;

        /* use the first free array element */
        while (index < type->num_elements && type->element[index] != NULL)
        {
            index++;
        }
        if (index >= type->num_elements)
        {
            coda_set_error(CODA_ERROR_INVALID_INDEX, "array index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                           type->num_elements, __FILE__, __LINE__);
            return -1;
        }
        type->element[index] = element;
    }
    else
    {
        if (type->num_elements % BLOCK_SIZE == 0)
        {
            coda_dynamic_type **new_element;

            new_element = realloc(type->element, (type->num_elements + BLOCK_SIZE) * sizeof(coda_dynamic_type *));
            if (new_element == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               (type->num_elements + BLOCK_SIZE) * sizeof(coda_dynamic_type *), __FILE__, __LINE__);
                return -1;
            }
            type->element = new_element;
        }
        type->num_elements++;
        type->element[type->num_elements - 1] = element;
    }

    return 0;
}